

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# brotli_bit_stream.c
# Opt level: O2

void StoreTrivialContextMap
               (size_t num_types,size_t context_bits,HuffmanTree *tree,size_t *storage_ix,
               uint8_t *storage)

{
  long lVar1;
  byte bVar2;
  size_t sVar3;
  ulong uVar4;
  long lVar5;
  ulong uVar6;
  ulong length;
  char *__assertion;
  uint uVar7;
  undefined8 local_7b0;
  uint8_t depths [272];
  uint16_t bits [272];
  uint32_t histogram [272];
  
  StoreVarLenUint8(num_types - 1,storage_ix,storage);
  if (1 < num_types) {
    lVar1 = context_bits - 1;
    length = (context_bits + num_types) - 1;
    local_7b0 = tree;
    memset(histogram,0,length * 4);
    uVar4 = *storage_ix;
    *(ulong *)(storage + (uVar4 >> 3)) = (ulong)storage[uVar4 >> 3] | 1L << ((byte)uVar4 & 7);
    uVar6 = uVar4 + 1;
    *storage_ix = uVar6;
    if (0xf < context_bits - 2) {
LAB_00116183:
      __assertion = "(bits >> n_bits) == 0";
      uVar7 = 0x36;
LAB_001161b3:
      __assert_fail(__assertion,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/brezza92[P]brotli/enc/././write_bits.h"
                    ,uVar7,
                    "void BrotliWriteBits(size_t, uint64_t, size_t *restrict, uint8_t *restrict)");
    }
    uVar7 = ~(-1 << ((byte)lVar1 & 0x1f));
    *(size_t *)(storage + (uVar6 >> 3)) =
         context_bits - 2 << ((byte)uVar6 & 7) | (ulong)storage[uVar6 >> 3];
    *storage_ix = uVar4 + 5;
    histogram[context_bits - 1] = (uint32_t)num_types;
    histogram[0] = 1;
    for (sVar3 = context_bits; sVar3 < length; sVar3 = sVar3 + 1) {
      histogram[sVar3] = 1;
    }
    BuildAndStoreHuffmanTree(histogram,length,local_7b0,depths,bits,storage_ix,storage);
    for (sVar3 = 0; num_types != sVar3; sVar3 = sVar3 + 1) {
      lVar5 = sVar3 + lVar1;
      if (sVar3 == 0) {
        lVar5 = 0;
      }
      bVar2 = depths[lVar5];
      if (bits[lVar5] >> (bVar2 & 0x3f) != 0) goto LAB_00116183;
      if (0x38 < bVar2) {
LAB_0011619c:
        __assertion = "n_bits <= 56";
        uVar7 = 0x37;
        goto LAB_001161b3;
      }
      uVar6 = *storage_ix;
      uVar4 = bVar2 + uVar6;
      *(ulong *)(storage + (uVar6 >> 3)) =
           (ulong)bits[lVar5] << ((byte)uVar6 & 7) | (ulong)storage[uVar6 >> 3];
      *storage_ix = uVar4;
      bVar2 = depths[context_bits - 1];
      if (bits[context_bits - 1] >> (bVar2 & 0x3f) != 0) goto LAB_00116183;
      if (0x38 < bVar2) goto LAB_0011619c;
      uVar6 = bVar2 + uVar4;
      *(ulong *)(storage + (uVar4 >> 3)) =
           (ulong)bits[context_bits - 1] << ((byte)uVar4 & 7) | (ulong)storage[uVar4 >> 3];
      *storage_ix = uVar6;
      if (uVar7 >> ((byte)lVar1 & 0x3f) != 0) goto LAB_00116183;
      *(ulong *)(storage + (uVar6 >> 3)) =
           (ulong)uVar7 << ((byte)uVar6 & 7) | (ulong)storage[uVar6 >> 3];
      *storage_ix = uVar6 + lVar1;
    }
    uVar6 = *storage_ix;
    *(ulong *)(storage + (uVar6 >> 3)) = (ulong)storage[uVar6 >> 3] | 1L << ((byte)uVar6 & 7);
    *storage_ix = uVar6 + 1;
  }
  return;
}

Assistant:

static void StoreTrivialContextMap(size_t num_types,
                                   size_t context_bits,
                                   HuffmanTree* tree,
                                   size_t* storage_ix,
                                   uint8_t* storage) {
  StoreVarLenUint8(num_types - 1, storage_ix, storage);
  if (num_types > 1) {
    size_t repeat_code = context_bits - 1u;
    size_t repeat_bits = (1u << repeat_code) - 1u;
    size_t alphabet_size = num_types + repeat_code;
    uint32_t histogram[BROTLI_MAX_CONTEXT_MAP_SYMBOLS];
    uint8_t depths[BROTLI_MAX_CONTEXT_MAP_SYMBOLS];
    uint16_t bits[BROTLI_MAX_CONTEXT_MAP_SYMBOLS];
    size_t i;
    memset(histogram, 0, alphabet_size * sizeof(histogram[0]));
    /* Write RLEMAX. */
    BrotliWriteBits(1, 1, storage_ix, storage);
    BrotliWriteBits(4, repeat_code - 1, storage_ix, storage);
    histogram[repeat_code] = (uint32_t)num_types;
    histogram[0] = 1;
    for (i = context_bits; i < alphabet_size; ++i) {
      histogram[i] = 1;
    }
    BuildAndStoreHuffmanTree(histogram, alphabet_size, tree,
                             depths, bits, storage_ix, storage);
    for (i = 0; i < num_types; ++i) {
      size_t code = (i == 0 ? 0 : i + context_bits - 1);
      BrotliWriteBits(depths[code], bits[code], storage_ix, storage);
      BrotliWriteBits(
          depths[repeat_code], bits[repeat_code], storage_ix, storage);
      BrotliWriteBits(repeat_code, repeat_bits, storage_ix, storage);
    }
    /* Write IMTF (inverse-move-to-front) bit. */
    BrotliWriteBits(1, 1, storage_ix, storage);
  }
}